

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall ot::commissioner::CommissionerImpl::Disconnect(CommissionerImpl *this)

{
  pointer puVar1;
  char *pcVar2;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *begin;
  char *from;
  bool bVar3;
  format_args args;
  writer write;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  char local_a0 [16];
  writer local_90;
  string local_88;
  format_string_checker<char> local_68;
  
  local_68.types_[0] = none_type;
  from = "the CoAPs client was disconnected";
  local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       "the CoAPs client was disconnected";
  local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x21;
  local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
  local_68.parse_funcs_[0] = (parse_func)0x0;
  local_90.handler_ = &local_68;
  local_68.context_.types_ = local_68.types_;
  do {
    if (from == "") break;
    to = from;
    if (*from == '{') {
LAB_00196626:
      fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_90,from,to);
      from = fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",&local_68);
      bVar3 = true;
    }
    else {
      to = from + 1;
      bVar3 = to != "";
      if (bVar3) {
        if (*to != '{') {
          pcVar2 = from + 2;
          do {
            to = pcVar2;
            bVar3 = to != "";
            if (to == "") goto LAB_00196622;
            pcVar2 = to + 1;
          } while (*to != '{');
        }
        bVar3 = true;
      }
LAB_00196622:
      if (bVar3) goto LAB_00196626;
      fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_90,from,"");
      bVar3 = false;
    }
  } while (bVar3);
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_68;
  fmt::v10::vformat_abi_cxx11_
            (&local_88,(v10 *)"the CoAPs client was disconnected",(string_view)ZEXT816(0x21),args);
  local_b8._0_4_ = kCancelled;
  local_b0._M_p = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  coap::CoapSecure::Disconnect(&this->mBrClient,(Error *)local_b8);
  if (local_b0._M_p != local_a0) {
    operator_delete(local_b0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  puVar1 = (this->mProxyClient).mMeshLocalPrefix.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mProxyClient).mMeshLocalPrefix.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->mProxyClient).mMeshLocalPrefix.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  this->mState = kDisabled;
  return;
}

Assistant:

void CommissionerImpl::Disconnect()
{
    mBrClient.Disconnect(ERROR_CANCELLED("the CoAPs client was disconnected"));
    mProxyClient.ClearMeshLocalPrefix();
    mState = State::kDisabled;
}